

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdppm.c
# Opt level: O0

JDIMENSION get_word_gray_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  undefined1 uVar1;
  undefined1 uVar2;
  uint uVar3;
  long lVar4;
  size_t sVar5;
  undefined1 *puVar6;
  long in_RSI;
  long *in_RDI;
  uint temp;
  uint maxval;
  JDIMENSION col;
  JSAMPLE *rescale;
  U_CHAR *bufferptr;
  JSAMPROW ptr;
  ppm_source_ptr source;
  int local_34;
  undefined1 *local_28;
  undefined1 *local_20;
  
  lVar4 = *(long *)(in_RSI + 0x48);
  uVar3 = *(uint *)(in_RSI + 0x50);
  sVar5 = fread(*(void **)(in_RSI + 0x30),1,*(size_t *)(in_RSI + 0x40),*(FILE **)(in_RSI + 0x18));
  if (sVar5 != *(size_t *)(in_RSI + 0x40)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x2b;
    (**(code **)*in_RDI)(in_RDI);
  }
  local_28 = *(undefined1 **)(in_RSI + 0x30);
  local_20 = (undefined1 *)**(undefined8 **)(in_RSI + 0x20);
  for (local_34 = (int)in_RDI[6]; local_34 != 0; local_34 = local_34 + -1) {
    puVar6 = local_28 + 1;
    uVar1 = *local_28;
    local_28 = local_28 + 2;
    uVar2 = *puVar6;
    if (uVar3 < CONCAT11(uVar1,uVar2)) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x407;
      (**(code **)*in_RDI)(in_RDI);
    }
    *local_20 = *(undefined1 *)(lVar4 + (ulong)(uint)CONCAT11(uVar1,uVar2));
    local_20 = local_20 + 1;
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_word_gray_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
/* This version is for reading raw-word-format PGM files with any maxval */
{
  ppm_source_ptr source = (ppm_source_ptr)sinfo;
  register JSAMPROW ptr;
  register U_CHAR *bufferptr;
  register JSAMPLE *rescale = source->rescale;
  JDIMENSION col;
  unsigned int maxval = source->maxval;

  if (!ReadOK(source->pub.input_file, source->iobuffer, source->buffer_width))
    ERREXIT(cinfo, JERR_INPUT_EOF);
  ptr = source->pub.buffer[0];
  bufferptr = source->iobuffer;
  for (col = cinfo->image_width; col > 0; col--) {
    register unsigned int temp;
    temp  = UCH(*bufferptr++) << 8;
    temp |= UCH(*bufferptr++);
    if (temp > maxval)
      ERREXIT(cinfo, JERR_PPM_OUTOFRANGE);
    *ptr++ = rescale[temp];
  }
  return 1;
}